

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3auxFilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                       sqlite3_value **apVal)

{
  Fts3MultiSegReader *pCsr;
  Fts3Table *p;
  int iVar1;
  uchar *puVar2;
  char *__s;
  size_t sVar3;
  sqlite3_vtab *__s_00;
  i64 iVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  uint local_54;
  int local_50;
  
  if (idxNum == 1) {
    local_54 = 1;
    uVar7 = 0xffffffff;
    local_50 = 0;
    uVar5 = 3;
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)idxNum >> 1 & 1;
    uVar7 = -(uint)((idxNum & 4U) == 0) | uVar6;
    local_54 = uVar6 + 1;
    if ((idxNum & 4U) == 0) {
      local_54 = uVar6;
    }
    local_50 = 1;
    uVar5 = 0x13;
  }
  p = (Fts3Table *)pCursor->pVtab[1].pModule;
  pCsr = (Fts3MultiSegReader *)(pCursor + 1);
  sqlite3Fts3SegReaderFinish(pCsr);
  sqlite3_free(pCursor[0xc].pVtab);
  sqlite3_free(pCursor[0x14].pVtab);
  memset(pCsr,0,0xa0);
  *(undefined4 *)&pCursor[0xe].pVtab = uVar5;
  if (((idxNum != 1 & ((byte)uVar6 ^ 1)) == 0) &&
     (puVar2 = sqlite3_value_text(*apVal), puVar2 != (uchar *)0x0)) {
    __s = sqlite3_mprintf("%s");
    ((Fts3SegFilter *)(pCursor + 0xc))->zTerm = __s;
    if (__s == (char *)0x0) {
      return 7;
    }
    sVar3 = strlen(__s);
    *(int *)&pCursor[0xd].pVtab = (int)sVar3;
  }
  if (-1 < (int)uVar7) {
    sqlite3_value_text(apVal[uVar7]);
    __s_00 = (sqlite3_vtab *)sqlite3_mprintf("%s");
    pCursor[0xf].pVtab = __s_00;
    if (__s_00 == (sqlite3_vtab *)0x0) {
      return 7;
    }
    sVar3 = strlen((char *)__s_00);
    *(int *)&pCursor[0x10].pVtab = (int)sVar3;
  }
  iVar1 = 0;
  if ((int)local_54 < nVal) {
    iVar4 = sqlite3VdbeIntValue(apVal[local_54]);
    iVar1 = 0;
    if (0 < (int)iVar4) {
      iVar1 = (int)iVar4;
    }
  }
  *(int *)((long)&pCursor[0x10].pVtab + 4) = iVar1;
  iVar1 = sqlite3Fts3SegReaderCursor
                    (p,iVar1,0,-2,(char *)pCursor[0xc].pVtab,*(int *)&pCursor[0xd].pVtab,0,local_50,
                     pCsr);
  if ((iVar1 == 0) &&
     (iVar1 = sqlite3Fts3SegReaderStart(p,pCsr,(Fts3SegFilter *)(pCursor + 0xc)), iVar1 == 0)) {
    iVar1 = fts3auxNextMethod(pCursor);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int fts3auxFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts3auxCursor *pCsr = (Fts3auxCursor *)pCursor;
  Fts3Table *pFts3 = ((Fts3auxTable *)pCursor->pVtab)->pFts3Tab;
  int rc;
  int isScan = 0;
  int iLangVal = 0;               /* Language id to query */

  int iEq = -1;                   /* Index of term=? value in apVal */
  int iGe = -1;                   /* Index of term>=? value in apVal */
  int iLe = -1;                   /* Index of term<=? value in apVal */
  int iLangid = -1;               /* Index of languageid=? value in apVal */
  int iNext = 0;

  UNUSED_PARAMETER(nVal);
  UNUSED_PARAMETER(idxStr);

  assert( idxStr==0 );
  assert( idxNum==FTS4AUX_EQ_CONSTRAINT || idxNum==0
       || idxNum==FTS4AUX_LE_CONSTRAINT || idxNum==FTS4AUX_GE_CONSTRAINT
       || idxNum==(FTS4AUX_LE_CONSTRAINT|FTS4AUX_GE_CONSTRAINT)
  );

  if( idxNum==FTS4AUX_EQ_CONSTRAINT ){
    iEq = iNext++;
  }else{
    isScan = 1;
    if( idxNum & FTS4AUX_GE_CONSTRAINT ){
      iGe = iNext++;
    }
    if( idxNum & FTS4AUX_LE_CONSTRAINT ){
      iLe = iNext++;
    }
  }
  if( iNext<nVal ){
    iLangid = iNext++;
  }

  /* In case this cursor is being reused, close and zero it. */
  testcase(pCsr->filter.zTerm);
  sqlite3Fts3SegReaderFinish(&pCsr->csr);
  sqlite3_free((void *)pCsr->filter.zTerm);
  sqlite3_free(pCsr->aStat);
  memset(&pCsr->csr, 0, ((u8*)&pCsr[1]) - (u8*)&pCsr->csr);

  pCsr->filter.flags = FTS3_SEGMENT_REQUIRE_POS|FTS3_SEGMENT_IGNORE_EMPTY;
  if( isScan ) pCsr->filter.flags |= FTS3_SEGMENT_SCAN;

  if( iEq>=0 || iGe>=0 ){
    const unsigned char *zStr = sqlite3_value_text(apVal[0]);
    assert( (iEq==0 && iGe==-1) || (iEq==-1 && iGe==0) );
    if( zStr ){
      pCsr->filter.zTerm = sqlite3_mprintf("%s", zStr);
      if( pCsr->filter.zTerm==0 ) return SQLITE_NOMEM;
      pCsr->filter.nTerm = (int)strlen(pCsr->filter.zTerm);
    }
  }

  if( iLe>=0 ){
    pCsr->zStop = sqlite3_mprintf("%s", sqlite3_value_text(apVal[iLe]));
    if( pCsr->zStop==0 ) return SQLITE_NOMEM;
    pCsr->nStop = (int)strlen(pCsr->zStop);
  }
  
  if( iLangid>=0 ){
    iLangVal = sqlite3_value_int(apVal[iLangid]);

    /* If the user specified a negative value for the languageid, use zero
    ** instead. This works, as the "languageid=?" constraint will also
    ** be tested by the VDBE layer. The test will always be false (since
    ** this module will not return a row with a negative languageid), and
    ** so the overall query will return zero rows.  */
    if( iLangVal<0 ) iLangVal = 0;
  }
  pCsr->iLangid = iLangVal;

  rc = sqlite3Fts3SegReaderCursor(pFts3, iLangVal, 0, FTS3_SEGCURSOR_ALL,
      pCsr->filter.zTerm, pCsr->filter.nTerm, 0, isScan, &pCsr->csr
  );
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts3SegReaderStart(pFts3, &pCsr->csr, &pCsr->filter);
  }

  if( rc==SQLITE_OK ) rc = fts3auxNextMethod(pCursor);
  return rc;
}